

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void read_long_string(LexState *ls,SemInfo *seminfo,int sep)

{
  size_t sVar1;
  byte *pbVar2;
  int iVar3;
  TString *pTVar4;
  char *msg;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_24;
  int cont;
  int sep_local;
  SemInfo *seminfo_local;
  LexState *ls_local;
  
  save(ls,ls->current);
  sVar1 = ls->z->n;
  ls->z->n = sVar1 - 1;
  if (sVar1 == 0) {
    local_24 = luaZ_fill(ls->z);
  }
  else {
    pbVar2 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar2 + 1);
    local_24 = (uint)*pbVar2;
  }
  ls->current = local_24;
  if ((ls->current == 10) || (ls->current == 0xd)) {
    inclinenumber(ls);
  }
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while (iVar3 = ls->current, iVar3 == -1) {
            msg = "unfinished long comment";
            if (seminfo != (SemInfo *)0x0) {
              msg = "unfinished long string";
            }
            luaX_lexerror(ls,msg,0x11f);
          }
          if ((iVar3 != 10) && (iVar3 != 0xd)) break;
          save(ls,10);
          inclinenumber(ls);
          if (seminfo == (SemInfo *)0x0) {
            ls->buff->n = 0;
          }
        }
        if (iVar3 != 0x5b) break;
        iVar3 = skip_sep(ls);
        if (iVar3 == sep) {
          save(ls,ls->current);
          sVar1 = ls->z->n;
          ls->z->n = sVar1 - 1;
          if (sVar1 == 0) {
            local_2c = luaZ_fill(ls->z);
          }
          else {
            pbVar2 = (byte *)ls->z->p;
            ls->z->p = (char *)(pbVar2 + 1);
            local_2c = (uint)*pbVar2;
          }
          ls->current = local_2c;
          if (sep == 0) {
            luaX_lexerror(ls,"nesting of [[...]] is deprecated",0x5b);
          }
        }
      }
      if (iVar3 == 0x5d) break;
      if (seminfo == (SemInfo *)0x0) {
        sVar1 = ls->z->n;
        ls->z->n = sVar1 - 1;
        if (sVar1 == 0) {
          local_38 = luaZ_fill(ls->z);
        }
        else {
          pbVar2 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar2 + 1);
          local_38 = (uint)*pbVar2;
        }
        ls->current = local_38;
      }
      else {
        save(ls,ls->current);
        sVar1 = ls->z->n;
        ls->z->n = sVar1 - 1;
        if (sVar1 == 0) {
          local_34 = luaZ_fill(ls->z);
        }
        else {
          pbVar2 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar2 + 1);
          local_34 = (uint)*pbVar2;
        }
        ls->current = local_34;
      }
    }
    iVar3 = skip_sep(ls);
  } while (iVar3 != sep);
  save(ls,ls->current);
  sVar1 = ls->z->n;
  ls->z->n = sVar1 - 1;
  if (sVar1 == 0) {
    local_30 = luaZ_fill(ls->z);
  }
  else {
    pbVar2 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar2 + 1);
    local_30 = (uint)*pbVar2;
  }
  ls->current = local_30;
  if (seminfo != (SemInfo *)0x0) {
    pTVar4 = luaX_newstring(ls,ls->buff->buffer + (sep + 2),ls->buff->n - (long)((sep + 2) * 2));
    seminfo->ts = pTVar4;
  }
  return;
}

Assistant:

static void read_long_string (LexState *ls, SemInfo *seminfo, int sep) {
  int cont = 0;
  (void)(cont);  /* avoid warnings when `cont' is not used */
  save_and_next(ls);  /* skip 2nd `[' */
  if (currIsNewline(ls))  /* string starts with a newline? */
    inclinenumber(ls);  /* skip it */
  for (;;) {
    switch (ls->current) {
      case EOZ:
        luaX_lexerror(ls, (seminfo) ? "unfinished long string" :
                                   "unfinished long comment", TK_EOS);
        break;  /* to avoid warnings */
#if defined(LUA_COMPAT_LSTR)
      case '[': {
        if (skip_sep(ls) == sep) {
          save_and_next(ls);  /* skip 2nd `[' */
          cont++;
#if LUA_COMPAT_LSTR == 1
          if (sep == 0)
            luaX_lexerror(ls, "nesting of [[...]] is deprecated", '[');
#endif
        }
        break;
      }
#endif
      case ']': {
        if (skip_sep(ls) == sep) {
          save_and_next(ls);  /* skip 2nd `]' */
#if defined(LUA_COMPAT_LSTR) && LUA_COMPAT_LSTR == 2
          cont--;
          if (sep == 0 && cont >= 0) break;
#endif
          goto endloop;
        }
        break;
      }
      case '\n':
      case '\r': {
        save(ls, '\n');
        inclinenumber(ls);
        if (!seminfo) luaZ_resetbuffer(ls->buff);  /* avoid wasting space */
        break;
      }
      default: {
        if (seminfo) save_and_next(ls);
        else next(ls);
      }
    }
  } endloop:
  if (seminfo)
    seminfo->ts = luaX_newstring(ls, luaZ_buffer(ls->buff) + (2 + sep),
                                     luaZ_bufflen(ls->buff) - 2*(2 + sep));
}